

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lucas.c
# Opt level: O3

void calc_statistics(float (*correct_vels) [512] [2],float (*norm_vels1) [512] [2],
                    float (*norm_vels2) [512] [2],int int_size_x,int int_size_y,
                    float (*full_vels) [512] [2],float (*E) [512],int pic_x,int pic_y,int n,
                    float *ave_error,float *st_dev,float *density,float *residual,float *min_angle,
                    float *max_angle,float *norm_ave_error1,float *norm_st_dev1,float *norm_density1
                    ,float *norm_min_angle1,float *norm_max_angle1,float *norm_ave_error2,
                    float *norm_st_dev2,float *norm_density2,float *norm_min_angle2,
                    float *norm_max_angle2)

{
  undefined4 uVar1;
  float (*paafVar2) [512] [2];
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  FILE *__stream;
  ulong uVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float histogram_error2 [100];
  float histogram_error [100];
  int histogram_count [100];
  ulong local_5f0;
  float local_5d8;
  float local_5d4;
  ulong local_5d0;
  uint local_5c4;
  uint local_5c0;
  uint local_5bc;
  undefined8 local_5b8;
  float fStack_5b0;
  float fStack_5ac;
  float (*local_5a8) [512] [2];
  undefined8 local_5a0;
  float (*local_598) [512] [2];
  float *local_590;
  float *local_588;
  float (*local_580) [512];
  float *local_578;
  float *local_570;
  float *local_568;
  int local_560;
  int local_55c;
  undefined8 local_558;
  undefined8 uStack_550;
  float *local_548;
  float *local_540;
  ulong local_538;
  float *local_530;
  float *local_528;
  float *local_520;
  float *local_518;
  float *local_510;
  float *local_508;
  float *local_500;
  float *local_4f8;
  float *local_4f0;
  float local_4e8 [100];
  float local_358 [100];
  int local_1c8 [102];
  
  local_590 = norm_max_angle2;
  local_548 = norm_density2;
  local_540 = norm_st_dev2;
  local_588 = norm_ave_error2;
  uVar11 = (ulong)(uint)n;
  local_5d0 = (ulong)(uint)pic_y;
  local_580 = E;
  local_578 = min_angle;
  *min_angle = INFINITY;
  local_570 = norm_min_angle1;
  *norm_min_angle1 = INFINITY;
  local_528 = max_angle;
  *max_angle = 0.0;
  local_518 = norm_max_angle1;
  *norm_max_angle1 = 0.0;
  local_568 = norm_min_angle2;
  *norm_min_angle2 = INFINITY;
  *norm_max_angle2 = 0.0;
  local_530 = residual;
  *residual = 0.0;
  local_508 = density;
  *density = 0.0;
  local_4f8 = st_dev;
  *st_dev = 0.0;
  local_510 = ave_error;
  *ave_error = 0.0;
  local_500 = norm_density1;
  *norm_density1 = 0.0;
  local_4f0 = norm_st_dev1;
  *norm_st_dev1 = 0.0;
  local_520 = norm_ave_error1;
  *norm_ave_error1 = 0.0;
  *norm_density2 = 0.0;
  *norm_st_dev2 = 0.0;
  uVar9 = 0;
  *norm_ave_error2 = 0.0;
  local_5b8 = norm_vels2;
  local_5a8 = full_vels;
  local_598 = norm_vels1;
  local_538 = uVar11;
  memset(local_4e8,0,400);
  memset(local_358,0,400);
  memset(local_1c8,0,400);
  local_55c = pic_x - n;
  local_5bc = 0;
  local_5c4 = 0;
  iVar10 = 0;
  local_5f0 = 0;
  local_5c0 = 0;
  fVar18 = 0.0;
  fVar21 = 0.0;
  local_558 = 0;
  uStack_550 = 0;
  uVar8 = 0;
  if (n < local_55c) {
    local_560 = (int)local_5d0 - n;
    lVar12 = (long)n;
    local_5d0 = (ulong)(uint)((int)local_5d0 + n * -2);
    lVar16 = lVar12 * 0x1008;
    lVar13 = (long)local_5a8 + lVar16 + 4;
    lVar17 = (long)correct_vels + lVar16;
    local_580 = (float (*) [512])((long)local_580 + lVar12 * 0x804);
    lVar14 = (long)local_598 + lVar16 + 4;
    lVar16 = (long)local_5b8 + lVar16 + 4;
    local_598 = (float (*) [512] [2])((long)Imag + lVar12 * 0x804);
    local_558 = 0;
    uStack_550 = 0;
    uVar8 = 0;
    fVar21 = 0.0;
    local_5c0 = 0;
    local_5f0 = 0;
    iVar10 = 0;
    local_5c4 = 0;
    local_5bc = 0;
    uVar9 = 0;
    do {
      if ((int)uVar11 < local_560) {
        local_5b8 = (float (*) [512] [2])CONCAT44(local_5b8._4_4_,fVar18);
        local_5a8 = (float (*) [512] [2])CONCAT44(local_5a8._4_4_,iVar10 + (int)local_5d0);
        lVar15 = 0;
        do {
          fVar18 = *(float *)(lVar13 + -4 + lVar15 * 8);
          if ((fVar18 != 100.0) || (NAN(fVar18))) {
            fVar19 = *(float *)(lVar13 + lVar15 * 8);
            if ((fVar19 == 100.0) && (!NAN(fVar19))) goto LAB_00103776;
            local_5a0 = *(undefined8 *)(lVar17 + lVar15 * 8);
            local_5d8 = fVar18;
            local_5d4 = fVar19;
            fVar19 = PsiER(&local_5d8,(float *)&local_5a0);
            *local_510 = *local_510 + fVar19;
            fVar18 = (*local_580)[lVar15];
            if ((fVar18 == 100.0) && (!NAN(fVar18))) {
              puts("Fatal error: E has no value");
              exit(1);
            }
            *local_530 = fVar18 + *local_530;
            if (fVar19 < *local_578) {
              *local_578 = fVar19;
            }
            uVar8 = uVar8 + 1;
            local_558 = CONCAT44(local_558._4_4_,(float)local_558 + fVar19 * fVar19);
            if (*local_528 <= fVar19 && fVar19 != *local_528) {
              *local_528 = fVar19;
            }
          }
          else {
LAB_00103776:
            local_5bc = local_5bc + 1;
          }
          fVar18 = *(float *)(lVar14 + -4 + lVar15 * 8);
          if ((fVar18 != 100.0) || (NAN(fVar18))) {
            fVar19 = *(float *)(lVar14 + lVar15 * 8);
            if ((fVar19 == 100.0) && (!NAN(fVar19))) goto LAB_00103837;
            local_5a0 = *(undefined8 *)(lVar17 + lVar15 * 8);
            local_5d8 = fVar18;
            local_5d4 = fVar19;
            fVar18 = PsiEN(&local_5d8,(float *)&local_5a0);
            *local_520 = *local_520 + fVar18;
            if (fVar18 < *local_570) {
              *local_570 = fVar18;
            }
            uVar9 = uVar9 + 1;
            fVar21 = fVar21 + fVar18 * fVar18;
            if (*local_518 <= fVar18 && fVar18 != *local_518) {
              *local_518 = fVar18;
            }
          }
          else {
LAB_00103837:
            local_5c4 = local_5c4 + 1;
          }
          fVar18 = *(float *)(lVar16 + -4 + lVar15 * 8);
          if ((fVar18 != 100.0) || (NAN(fVar18))) {
            fVar19 = *(float *)(lVar16 + lVar15 * 8);
            if ((fVar19 == 100.0) && (!NAN(fVar19))) goto LAB_0010393e;
            local_5a0 = *(undefined8 *)(lVar17 + lVar15 * 8);
            local_5d8 = fVar18;
            local_5d4 = fVar19;
            fVar18 = PsiEN(&local_5d8,(float *)&local_5a0);
            *local_588 = *local_588 + fVar18;
            if (fVar18 < *local_568) {
              *local_568 = fVar18;
            }
            if (*local_590 <= fVar18 && fVar18 != *local_590) {
              *local_590 = fVar18;
            }
            local_5f0 = (ulong)((int)local_5f0 + 1);
            local_5b8 = (float (*) [512] [2])
                        CONCAT44(local_5b8._4_4_,(float)local_5b8 + fVar18 * fVar18);
            iVar10 = (int)(*local_598)[0][lVar15];
            if (0x18 < iVar10) {
              iVar10 = 0x19;
            }
            local_358[iVar10] = local_358[iVar10] + fVar18;
            local_4e8[iVar10] = fVar18 * fVar18 + local_4e8[iVar10];
            local_1c8[iVar10] = local_1c8[iVar10] + 1;
          }
          else {
LAB_0010393e:
            local_5c0 = local_5c0 + 1;
          }
          lVar15 = lVar15 + 1;
        } while ((int)local_5d0 != (int)lVar15);
        uVar11 = local_538;
        fVar18 = (float)local_5b8;
        iVar10 = (int)local_5a8;
      }
      lVar12 = lVar12 + 1;
      lVar13 = lVar13 + 0x1000;
      lVar17 = lVar17 + 0x1000;
      local_580 = local_580 + 1;
      lVar14 = lVar14 + 0x1000;
      lVar16 = lVar16 + 0x1000;
      local_598 = (float (*) [512] [2])(*local_598 + 0x100);
    } while (local_55c != (int)lVar12);
  }
  pfVar7 = local_510;
  pfVar6 = local_518;
  pfVar5 = local_520;
  pfVar4 = local_528;
  pfVar3 = local_588;
  fVar24 = (float)(int)uVar8;
  local_5a8 = (float (*) [512] [2])CONCAT44(local_5a8._4_4_,iVar10);
  fVar23 = (float)iVar10;
  *local_508 = (fVar24 * 100.0) / fVar23;
  fVar20 = (float)(int)uVar9;
  *local_500 = (fVar20 * 100.0) / fVar23;
  fVar19 = (float)(int)local_5f0;
  local_5d0 = CONCAT44(local_5d0._4_4_,fVar23);
  *local_548 = (fVar19 * 100.0) / fVar23;
  fVar23 = 0.0;
  if (uVar8 != 0) {
    fVar23 = *local_510 / fVar24;
  }
  *local_510 = fVar23;
  fVar23 = 0.0;
  fVar22 = 0.0;
  if (uVar9 != 0) {
    fVar22 = *local_520 / fVar20;
  }
  *local_520 = fVar22;
  if ((int)local_5f0 != 0) {
    fVar23 = *local_588 / fVar19;
  }
  *local_588 = fVar23;
  fVar23 = 0.0;
  fVar22 = 0.0;
  if (1 < (int)uVar8) {
    fVar22 = SQRT(ABS(((float)local_558 - fVar24 * *local_510 * *local_510) /
                      (float)(int)(uVar8 - 1)));
  }
  *local_4f8 = fVar22;
  local_5b8._0_4_ = fVar18;
  if (1 < (int)uVar9) {
    fVar23 = (fVar21 - fVar20 * *local_520 * *local_520) / (float)(int)(uVar9 - 1);
    if (fVar23 < 0.0) {
      local_558 = CONCAT44(local_558._4_4_,fVar19);
      fVar23 = sqrtf(fVar23);
      fVar19 = (float)local_558;
    }
    else {
      fVar23 = SQRT(fVar23);
    }
  }
  *local_4f0 = fVar23;
  fVar21 = 0.0;
  if (1 < (int)local_5f0) {
    fVar21 = *pfVar3;
    fVar21 = ((float)local_5b8 - fVar19 * fVar21 * fVar21) / (float)((int)local_5f0 + -1);
    if (fVar21 < 0.0) {
      fVar21 = sqrtf(fVar21);
    }
    else {
      fVar21 = SQRT(fVar21);
    }
  }
  paafVar2 = local_5a8;
  *local_540 = fVar21;
  if (uVar8 != 0) {
    *local_530 = *local_530 / fVar24;
  }
  if ((*pfVar7 == 0.0) && (!NAN(*pfVar7))) {
    *pfVar4 = 0.0;
    *local_578 = 0.0;
  }
  if ((*pfVar5 == 0.0) && (!NAN(*pfVar5))) {
    *pfVar6 = 0.0;
    *local_570 = 0.0;
  }
  fVar21 = *pfVar3;
  iVar10 = (int)local_5a8;
  if ((fVar21 == 0.0) && (!NAN(fVar21))) {
    *local_590 = 0.0;
    *local_568 = 0.0;
  }
  puts("\nIn calc_statistics");
  printf("%d full velocities\n",(ulong)uVar8);
  printf("%d positons without full velocity\n",(ulong)local_5bc);
  printf("%d positions in total\n",(ulong)paafVar2 & 0xffffffff);
  printf("%d least squares normal velocities\n",(ulong)uVar9);
  printf("%d positons without least squares normal velocity\n",(ulong)local_5c4);
  printf("%d positions with full or least squares normal velocity\n",
         (ulong)(iVar10 - (uVar9 + uVar8)));
  printf("%d raw normal velocities\n",local_5f0);
  printf("%d positons without raw normal velocity\n",(ulong)local_5c0);
  __stream = fopen("lucas.plot.data","w");
  fprintf(__stream,"%d\n",0x19);
  if (RAW_STATISTICS != 0) {
    puts("\n                             Raw Normal Velocity Analysis");
    puts("\n                                  Histogram Error\n");
    lVar16 = 0;
    do {
      local_5b8 = (float (*) [512] [2])((double)(int)lVar16 + 0.5);
      printf("Bin:%5.2f Average Error:%8.5f St. Dev:%8.5f Count:%5d Density:%6.3f\n");
      fprintf(__stream,"%f %f %f %f\n",(int)local_5b8);
      lVar16 = lVar16 + 1;
    } while (lVar16 != 0x19);
    fwrite("\n\n\n",3,1,__stream);
    lVar16 = 0;
    fprintf(__stream,"%d\n",0x19);
    puts("\n                                 Cumulative Error\n");
    fVar21 = 0.0;
    fVar18 = 0.0;
    fVar19 = 0.0;
    fVar23 = 0.0;
    uVar8 = 0;
    do {
      fVar21 = fVar21 + local_358[lVar16];
      fVar18 = fVar18 + local_4e8[lVar16];
      fVar19 = fVar19 + 0.0;
      fVar23 = fVar23 + 0.0;
      uVar8 = uVar8 + local_1c8[lVar16];
      lVar16 = lVar16 + 1;
    } while (lVar16 != 0x19);
    lVar16 = 0;
    do {
      fVar24 = fVar21 / (float)(int)uVar8;
      uVar1 = 0;
      fVar20 = 0.0;
      if (1 < (int)uVar8) {
        fVar20 = (fVar18 - (float)(int)uVar8 * fVar24 * fVar24) / (float)(int)(uVar8 - 1);
      }
      if (uVar8 != 0) {
        uVar1 = SUB84((double)fVar24,0);
      }
      fStack_5b0 = fVar19;
      fStack_5ac = fVar23;
      local_5b8._0_4_ = fVar21;
      local_5b8._4_4_ = fVar18;
      printf("Bin:>%5.2f Average Error:%8.5f St. Dev:%8.5f Count:%5d Density:%6.3f\n",(ulong)uVar8);
      fprintf(__stream,"%f %f %f %f\n",SUB84((double)(int)lVar16,0),uVar1,
              SUB84((double)SQRT(ABS(fVar20)),0));
      fVar21 = (float)local_5b8 - local_358[lVar16];
      fVar18 = local_5b8._4_4_ - local_4e8[lVar16];
      fVar19 = fStack_5b0 - 0.0;
      fVar23 = fStack_5ac - 0.0;
      uVar8 = uVar8 - local_1c8[lVar16];
      lVar16 = lVar16 + 1;
    } while (lVar16 != 0x19);
    fputc(10,__stream);
    fclose(__stream);
  }
  fflush(_stdout);
  return;
}

Assistant:

void calc_statistics(float correct_vels[PIC_X][PIC_Y][2],
				float norm_vels1[PIC_X][PIC_Y][2],
				float norm_vels2[PIC_X][PIC_Y][2],
				int int_size_x, int int_size_y,
				float full_vels[PIC_X][PIC_Y][2],
				float E[PIC_X][PIC_Y], int pic_x,
				int pic_y, int n, float *ave_error,
				float *st_dev,float *density, float *residual,
				float *min_angle, float *max_angle,
				float *norm_ave_error1,float *norm_st_dev1,
				float *norm_density1, float *norm_min_angle1,
				float *norm_max_angle1, float *norm_ave_error2,
				float *norm_st_dev2, float *norm_density2,
				float *norm_min_angle2, float *norm_max_angle2)
{
FILE *fp;
int full_count,norm_count1,no_full_count,no_norm_count1,i,j,total_count;
int norm_count2,no_norm_count2;
float normal_sumX2_1,normal_sumX2_2,sumX2,temp,uva[2],uve[2],bin_err2;
float histogram_error[100],histogram_error2[100],bin_sum,bin_ave,bin_st_dev;
float bin_density;
int histogram_count[100],int_mag,bin_ct;

full_count = norm_count1 = norm_count2 = no_full_count = no_norm_count1 = no_norm_count2 = total_count = 0;
normal_sumX2_1 = normal_sumX2_2 = sumX2 = 0.0;
(*norm_min_angle1) = (*min_angle) = (float) HUGE_VAL;
(*norm_max_angle1) = (*max_angle) = 0.0f;
(*norm_min_angle2) = (float) HUGE_VAL;
(*norm_max_angle2) = 0.0f;
(*ave_error) = (*st_dev) = (*density) = (*residual) = 0.0f;
(*norm_ave_error1) = (*norm_st_dev1) = (*norm_density1) = 0.0f;
(*norm_ave_error2) = (*norm_st_dev2) = (*norm_density2) = 0.0f;

for(i=0;i<100;i++) { histogram_error[i]=histogram_error2[i]=0.0; histogram_count[i]=0; }


for(i=n;i<pic_x-n;i++)
{
for(j=n;j<pic_y-n;j++)
	{
	if(full_vels[i][j][0] != NO_VALUE && full_vels[i][j][1] != NO_VALUE)
	  {
	  full_count++;
	  uve[0] = full_vels[i][j][0]; uve[1] = full_vels[i][j][1];
	  uva[0] = correct_vels[i][j][0]; uva[1] = correct_vels[i][j][1];
	  temp = PsiER(uve,uva);
	  (*ave_error) += temp;
	  if(E[i][j] == NO_VALUE)
		{ printf("Fatal error: E has no value\n"); exit(1); }
	  (*residual) += E[i][j];
	  sumX2 += temp*temp;
	  if(temp < (*min_angle)) (*min_angle) = temp;
	  if(temp > (*max_angle)) (*max_angle) = temp;
	  }
	else no_full_count++;

	if(norm_vels1[i][j][0] != NO_VALUE && norm_vels1[i][j][1] != NO_VALUE)
	  {
	  norm_count1++;
	  uve[0] = norm_vels1[i][j][0]; uve[1] = norm_vels1[i][j][1];
	  uva[0] = correct_vels[i][j][0]; uva[1] = correct_vels[i][j][1];
	  temp = PsiEN(uve,uva);
	  (*norm_ave_error1) += temp;
	  normal_sumX2_1 += temp*temp;
	  if(temp < (*norm_min_angle1)) (*norm_min_angle1) = temp;
	  if(temp > (*norm_max_angle1)) (*norm_max_angle1) = temp;
	  }
	else no_norm_count1++;

	if(norm_vels2[i][j][0] != NO_VALUE && norm_vels2[i][j][1] != NO_VALUE)
	  {
	  norm_count2++;
	  uve[0] = norm_vels2[i][j][0]; uve[1] = norm_vels2[i][j][1];
	  uva[0] = correct_vels[i][j][0]; uva[1] = correct_vels[i][j][1];
	  temp = PsiEN(uve,uva);
	  (*norm_ave_error2) += temp;
	  normal_sumX2_2 += temp*temp;
	  if(temp < (*norm_min_angle2)) (*norm_min_angle2) = temp;
	  if(temp > (*norm_max_angle2)) (*norm_max_angle2) = temp;
	  int_mag = (int) (Imag[i][j]);
	  if(int_mag >= MAX_I) int_mag = MAX_I;
	  histogram_error[int_mag] += temp;
	  histogram_error2[int_mag] += temp*temp;
	  histogram_count[int_mag]++;
	  }
	else no_norm_count2++;

	total_count++;
	}
}
(*density) = (full_count*100.0f)/(total_count);
(*norm_density1) = (norm_count1*100.0f)/(total_count);
(*norm_density2) = (norm_count2*100.0f)/(total_count);

if(full_count != 0) (*ave_error) = (*ave_error)/full_count;
else (*ave_error) = 0.0;
if(norm_count1 != 0) (*norm_ave_error1) = (*norm_ave_error1)/norm_count1;
else (*norm_ave_error1) = 0.0;
if(norm_count2 != 0) (*norm_ave_error2) = (*norm_ave_error2)/norm_count2;
else (*norm_ave_error2) = 0.0;

if(full_count > 1)
{
temp =(float) (fabs((sumX2 - full_count*(*ave_error)*(*ave_error))/(full_count-1)));
(*st_dev) = (float) sqrt(temp);
}
else (*st_dev) = 0.0f;
if(norm_count1 > 1)
(*norm_st_dev1) = (float) (sqrt((normal_sumX2_1 - norm_count1*(*norm_ave_error1)*(*norm_ave_error1))/(norm_count1-1)));
else (*norm_st_dev1) = 0.0;
if(norm_count2 > 1)
(*norm_st_dev2) = (float) (sqrt((normal_sumX2_2 - norm_count2*(*norm_ave_error2)*(*norm_ave_error2))/(norm_count2-1)));
else (*norm_st_dev2) = 0.0;

if(full_count != 0) (*residual) = (*residual)/full_count;
if((*ave_error) == 0.0) { (*min_angle) = (*max_angle) = 0.0; }
if((*norm_ave_error1) == 0.0) { (*norm_min_angle1) = (*norm_max_angle1) = 0.0; }
if((*norm_ave_error2) == 0.0) { (*norm_min_angle2) = (*norm_max_angle2) = 0.0; }

printf("\nIn calc_statistics\n");
printf("%d full velocities\n",full_count);
printf("%d positons without full velocity\n",no_full_count);
printf("%d positions in total\n",total_count);
printf("%d least squares normal velocities\n",norm_count1);
printf("%d positons without least squares normal velocity\n",no_norm_count1);
printf("%d positions with full or least squares normal velocity\n",
	total_count-full_count-norm_count1);
printf("%d raw normal velocities\n",norm_count2);
printf("%d positons without raw normal velocity\n",no_norm_count2);

fp =fopen("lucas.plot.data","w");
fprintf(fp,"%d\n",MAX_I);
if(RAW_STATISTICS)
{
printf("\n                             Raw Normal Velocity Analysis\n");
printf("\n                                  Histogram Error\n\n");
for(i=0;i<MAX_I;i++)
	{
     	if(histogram_count[i] != 0.0) bin_ave = histogram_error[i]/(histogram_count[i]*1.0f);
     	else bin_ave = 0.0;
	if(histogram_count[i] > 1) temp = ((histogram_error2[i]-histogram_count[i]*bin_ave*bin_ave)/(histogram_count[i]-1.0f));
	else temp = 0.0;
	bin_density = histogram_count[i]*100.0f/total_count;
	bin_st_dev = (float) sqrt(fabs(temp));
     	printf("Bin:%5.2f Average Error:%8.5f St. Dev:%8.5f Count:%5d Density:%6.3f\n",i+0.5,bin_ave,bin_st_dev,histogram_count[i],bin_density);
     	fprintf(fp,"%f %f %f %f\n",i+0.5,bin_ave,bin_st_dev,bin_density);
	}
fprintf(fp,"\n\n\n");
fprintf(fp,"%d\n",MAX_I);
printf("\n                                 Cumulative Error\n\n");
bin_sum = 0.0; bin_ct=0; bin_err2 = 0.0;
for(i=0;i<MAX_I;i++)
     {
     bin_sum += histogram_error[i];
     bin_err2 += histogram_error2[i];
     bin_ct += histogram_count[i];
     }
for(i=0;i<MAX_I;i++)
     {
     if(bin_ct != 0) bin_ave = bin_sum/bin_ct; else bin_ave = 0.0;
     bin_density = bin_ct*100.0f/total_count;
     if(bin_ct > 1)  temp = ((bin_err2-bin_ct*bin_ave*bin_ave)/(bin_ct-1));
     else temp = 0.0;
     bin_st_dev = (float) sqrt(fabs(temp));
     printf("Bin:>%5.2f Average Error:%8.5f St. Dev:%8.5f Count:%5d Density:%6.3f\n",i*1.0,bin_ave,bin_st_dev,bin_ct,bin_density);
     fprintf(fp,"%f %f %f %f\n",i*1.0,bin_ave,bin_st_dev,bin_density);
     bin_sum -= histogram_error[i];
     bin_err2 -= histogram_error2[i];
     bin_ct -= histogram_count[i];
     }
fprintf(fp,"\n");
fclose(fp);
}
fflush(stdout);
}